

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DecimalDatatypeValidator::checkContent
          (DecimalDatatypeValidator *this,XMLCh *content,ValidationContext *context,bool asBase,
          MemoryManager *manager)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  DatatypeValidator *pDVar5;
  RegularExpression *this_00;
  InvalidDatatypeValueException *pIVar6;
  XMLCh *pXVar7;
  RefVectorOf<xercesc_4_0::XMLNumber> *pRVar8;
  BaseRefVectorOf<xercesc_4_0::XMLNumber> *pBVar9;
  XMLNumber *pXVar10;
  InvalidDatatypeFacetException *pIVar11;
  XMLCh local_3f8 [4];
  XMLCh value2_2 [65];
  XMLCh local_368 [4];
  XMLCh value1_2 [65];
  XMLCh local_2d8 [4];
  XMLCh value2_1 [65];
  XMLCh local_248 [4];
  XMLCh value1_1 [65];
  XMLCh local_1b8 [4];
  XMLCh value2 [65];
  XMLCh local_128 [4];
  XMLCh value1 [65];
  XMLSize_t enumLength;
  XMLSize_t i;
  XMLBigDecimal *compareData;
  XMLBigDecimal compareDataValue;
  int thisFacetsDefined;
  DecimalDatatypeValidator *pBase;
  MemoryManager *manager_local;
  bool asBase_local;
  ValidationContext *context_local;
  XMLCh *content_local;
  DecimalDatatypeValidator *this_local;
  
  pDVar5 = DatatypeValidator::getBaseValidator((DatatypeValidator *)this);
  if (pDVar5 != (DatatypeValidator *)0x0) {
    (*(pDVar5->super_XSerializable)._vptr_XSerializable[0x11])(pDVar5,content,context,1,manager);
  }
  uVar2 = DatatypeValidator::getFacetsDefined((DatatypeValidator *)this);
  if ((uVar2 & 8) != 0) {
    this_00 = DatatypeValidator::getRegex((DatatypeValidator *)this);
    bVar1 = RegularExpression::matches(this_00,content,manager);
    if (!bVar1) {
      pIVar6 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
      pXVar7 = DatatypeValidator::getPattern((DatatypeValidator *)this);
      InvalidDatatypeValueException::InvalidDatatypeValueException
                (pIVar6,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                 ,0x199,VALUE_NotMatch_Pattern,content,pXVar7,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      __cxa_throw(pIVar6,&InvalidDatatypeValueException::typeinfo,
                  InvalidDatatypeValueException::~InvalidDatatypeValueException);
    }
  }
  if (!asBase) {
    XMLBigDecimal::XMLBigDecimal((XMLBigDecimal *)&compareData,content,manager);
    pRVar8 = AbstractNumericFacetValidator::getEnumeration((AbstractNumericFacetValidator *)this);
    if (pRVar8 != (RefVectorOf<xercesc_4_0::XMLNumber> *)0x0) {
      enumLength = 0;
      pBVar9 = &AbstractNumericFacetValidator::getEnumeration((AbstractNumericFacetValidator *)this)
                ->super_BaseRefVectorOf<xercesc_4_0::XMLNumber>;
      register0x00000000 = BaseRefVectorOf<xercesc_4_0::XMLNumber>::size(pBVar9);
      for (; enumLength < stack0xffffffffffffff60; enumLength = enumLength + 1) {
        pBVar9 = &AbstractNumericFacetValidator::getEnumeration
                            ((AbstractNumericFacetValidator *)this)->
                  super_BaseRefVectorOf<xercesc_4_0::XMLNumber>;
        pXVar10 = BaseRefVectorOf<xercesc_4_0::XMLNumber>::elementAt(pBVar9,enumLength);
        iVar3 = (*(this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
                  super_DatatypeValidator.super_XSerializable._vptr_XSerializable[0x10])
                          (this,(XMLBigDecimal *)&compareData,pXVar10);
        if (iVar3 == 0) break;
      }
      if (enumLength == stack0xffffffffffffff60) {
        pIVar6 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar6,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                   ,0x1b0,VALUE_NotIn_Enumeration,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   manager);
        __cxa_throw(pIVar6,&InvalidDatatypeValueException::typeinfo,
                    InvalidDatatypeValueException::~InvalidDatatypeValueException);
      }
    }
    AbstractNumericValidator::boundsCheck
              (&this->super_AbstractNumericValidator,(XMLNumber *)&compareData,manager);
    if (((uVar2 & 0x400) != 0) &&
       (uVar4 = XMLBigDecimal::getScale((XMLBigDecimal *)&compareData),
       this->fFractionDigits < uVar4)) {
      uVar2 = XMLBigDecimal::getScale((XMLBigDecimal *)&compareData);
      XMLString::binToText(uVar2,local_128,0x40,10,manager);
      XMLString::binToText(this->fFractionDigits,local_1b8,0x40,10,manager);
      pIVar11 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      pXVar7 = (XMLCh *)(*(code *)compareData->fIntVal)();
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar11,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                 ,0x1c2,VALUE_exceed_fractDigit,pXVar7,local_128,local_1b8,(XMLCh *)0x0,manager);
      __cxa_throw(pIVar11,&InvalidDatatypeFacetException::typeinfo,
                  InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
    }
    if ((uVar2 & 0x200) != 0) {
      uVar2 = XMLBigDecimal::getTotalDigit((XMLBigDecimal *)&compareData);
      if (this->fTotalDigits < uVar2) {
        uVar2 = XMLBigDecimal::getTotalDigit((XMLBigDecimal *)&compareData);
        XMLString::binToText(uVar2,local_248,0x40,10,manager);
        XMLString::binToText(this->fTotalDigits,local_2d8,0x40,10,manager);
        pIVar11 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        pXVar7 = (XMLCh *)(*(code *)compareData->fIntVal)();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar11,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                   ,0x1d3,VALUE_exceed_totalDigit,pXVar7,local_248,local_2d8,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar11,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      uVar2 = XMLBigDecimal::getScale((XMLBigDecimal *)&compareData);
      if (this->fTotalDigits < uVar2) {
        uVar2 = XMLBigDecimal::getScale((XMLBigDecimal *)&compareData);
        XMLString::binToText(uVar2,local_368,0x40,10,manager);
        XMLString::binToText(this->fTotalDigits,local_3f8,0x40,10,manager);
        pIVar11 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        pXVar7 = (XMLCh *)(*(code *)compareData->fIntVal)();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar11,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                   ,0x1e7,VALUE_exceed_totalDigit,pXVar7,local_368,local_3f8,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar11,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    XMLBigDecimal::~XMLBigDecimal((XMLBigDecimal *)&compareData);
  }
  return;
}

Assistant:

void DecimalDatatypeValidator::checkContent(const XMLCh*             const content
                                           ,      ValidationContext* const context
                                           ,      bool                     asBase
                                           ,      MemoryManager*     const manager)
{
    //validate against base validator if any
    DecimalDatatypeValidator *pBase = (DecimalDatatypeValidator*) this->getBaseValidator();
    if (pBase)
        pBase->checkContent(content, context, true, manager);

    int thisFacetsDefined = getFacetsDefined();

    // we check pattern first
    if ( (thisFacetsDefined & DatatypeValidator::FACET_PATTERN ) != 0 )
    {
        if (getRegex()->matches(content, manager) ==false)
        {
            ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_NotMatch_Pattern
                    , content
                    , getPattern()
                    , manager);
        }
    }

    // if this is a base validator, we only need to check pattern facet
    // all other facet were inherited by the derived type
    if (asBase)
        return;

    XMLBigDecimal  compareDataValue(content, manager);
    XMLBigDecimal* compareData = &compareDataValue;

    if (getEnumeration())
    {
        XMLSize_t i=0;
        XMLSize_t enumLength = getEnumeration()->size();
        for ( ; i < enumLength; i++)
        {
            if (compareValues(compareData, (XMLBigDecimal*) getEnumeration()->elementAt(i)) ==0 )
                break;
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }

    boundsCheck(compareData, manager);

    if ( (thisFacetsDefined & DatatypeValidator::FACET_FRACTIONDIGITS) != 0 )
    {
        if ( compareData->getScale() > fFractionDigits )
        {
            XMLCh value1[BUF_LEN+1];
            XMLCh value2[BUF_LEN+1];
            XMLString::binToText(compareData->getScale(), value1, BUF_LEN, 10, manager);
            XMLString::binToText(fFractionDigits, value2, BUF_LEN, 10, manager);
            ThrowXMLwithMemMgr3(InvalidDatatypeFacetException
                              , XMLExcepts::VALUE_exceed_fractDigit
                              , compareData->getRawData()
                              , value1
                              , value2
                              , manager);
        }
    }

    if ( (thisFacetsDefined & DatatypeValidator::FACET_TOTALDIGITS) != 0 )
    {
        if ( compareData->getTotalDigit() > fTotalDigits )
        {
            XMLCh value1[BUF_LEN+1];
            XMLCh value2[BUF_LEN+1];
            XMLString::binToText(compareData->getTotalDigit(), value1, BUF_LEN, 10, manager);
            XMLString::binToText(fTotalDigits, value2, BUF_LEN, 10, manager);
            ThrowXMLwithMemMgr3(InvalidDatatypeFacetException
                              , XMLExcepts::VALUE_exceed_totalDigit
                              , compareData->getRawData()
                              , value1
                              , value2
                              , manager);
        }

        /***
         E2-44 totalDigits
         ... by restricting it to numbers that are expressible as i x 10^-n
         where i and n are integers such that |i| < 10^totalDigits and 0 <= n <= totalDigits.
         ***/

        if ( compareData->getScale() > fTotalDigits )
        {
            XMLCh value1[BUF_LEN+1];
            XMLCh value2[BUF_LEN+1];
            XMLString::binToText(compareData->getScale(), value1, BUF_LEN, 10, manager);
            XMLString::binToText(fTotalDigits, value2, BUF_LEN, 10, manager);
            ThrowXMLwithMemMgr3(InvalidDatatypeFacetException
                              , XMLExcepts::VALUE_exceed_totalDigit
                              , compareData->getRawData()
                              , value1
                              , value2
                              , manager);
        }
    }
}